

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O1

void google::protobuf::strings::SubstituteAndAppend
               (string *output,char *format,SubstituteArg *arg0,SubstituteArg *arg1,
               SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,SubstituteArg *arg5,
               SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,SubstituteArg *arg9)

{
  byte bVar1;
  size_type sVar2;
  string *psVar3;
  char cVar4;
  pointer pcVar5;
  LogMessage *pLVar6;
  int iVar7;
  SubstituteArg *pSVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  char *__dest;
  bool bVar14;
  SubstituteArg *args_array [11];
  LogFinisher local_122;
  allocator local_121;
  string local_120;
  int local_fc;
  string local_f8;
  string *local_d8;
  SubstituteArg *local_d0;
  ulong local_c8;
  LogMessage local_c0;
  SubstituteArg *local_88 [10];
  undefined8 local_38;
  
  local_88[0] = arg0;
  local_88[1] = arg1;
  local_88[2] = arg2;
  local_88[3] = arg3;
  local_88[4] = arg4;
  local_88[5] = arg5;
  local_88[6] = arg6;
  local_88[7] = arg7;
  local_88[8] = arg8;
  local_88[9] = arg9;
  local_38 = 0;
  cVar4 = *format;
  bVar14 = cVar4 != '\0';
  local_d8 = output;
  local_d0 = arg0;
  if (cVar4 == '\0') {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    lVar13 = 0;
    do {
      iVar12 = (int)lVar13;
      iVar9 = (int)uVar10;
      if (cVar4 == '$') {
        bVar1 = format[(long)iVar12 + 1];
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar11 = bVar1 - 0x30;
          iVar7 = local_88[uVar11]->size_;
          if (iVar7 == -1) {
            local_fc = iVar7;
            local_c8 = uVar10;
            internal::LogMessage::LogMessage
                      (&local_c0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                       ,0x54);
            pLVar6 = internal::LogMessage::operator<<
                               (&local_c0,"strings::Substitute format string invalid: asked for \"$"
                               );
            pLVar6 = internal::LogMessage::operator<<(pLVar6,uVar11);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,"\", but only ");
            lVar13 = 0;
            pSVar8 = local_d0;
            do {
              if (pSVar8->size_ == -1) break;
              pSVar8 = local_88[lVar13 + 1];
              lVar13 = lVar13 + 1;
            } while (pSVar8 != (SubstituteArg *)0x0);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,(int)lVar13);
            pLVar6 = internal::LogMessage::operator<<
                               (pLVar6," args were given.  Full format string was: \"");
            std::__cxx11::string::string((string *)&local_f8,format,&local_121);
            CEscape(&local_120,&local_f8);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_120);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,"\".");
            internal::LogFinisher::operator=(&local_122,pLVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            internal::LogMessage::~LogMessage(&local_c0);
            uVar10 = local_c8;
            iVar7 = local_fc;
          }
          else {
            uVar10 = (ulong)(uint)(iVar9 + iVar7);
            iVar12 = iVar12 + 1;
          }
          if (iVar7 == -1) break;
        }
        else {
          if (bVar1 != 0x24) {
            internal::LogMessage::LogMessage
                      (&local_c0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                       ,0x61);
            pLVar6 = internal::LogMessage::operator<<
                               (&local_c0,"Invalid strings::Substitute() format string: \"");
            std::__cxx11::string::string((string *)&local_f8,format,&local_121);
            CEscape(&local_120,&local_f8);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_120);
            pLVar6 = internal::LogMessage::operator<<(pLVar6,"\".");
            internal::LogFinisher::operator=(&local_122,pLVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            internal::LogMessage::~LogMessage(&local_c0);
            break;
          }
          uVar10 = (ulong)(iVar9 + 1);
          iVar12 = iVar12 + 1;
        }
      }
      else {
        uVar10 = (ulong)(iVar9 + 1);
      }
      cVar4 = format[(long)iVar12 + 1];
      lVar13 = (long)iVar12 + 1;
      bVar14 = cVar4 != '\0';
    } while (bVar14);
  }
  psVar3 = local_d8;
  if ((!bVar14) && ((int)uVar10 != 0)) {
    sVar2 = local_d8->_M_string_length;
    iVar12 = 0;
    std::__cxx11::string::resize((ulong)local_d8,(char)uVar10 + (char)sVar2);
    if (psVar3->_M_string_length == 0) {
      pcVar5 = (pointer)0x0;
    }
    else {
      pcVar5 = (psVar3->_M_dataplus)._M_p;
    }
    __dest = pcVar5 + (int)sVar2;
    do {
      cVar4 = format[iVar12];
      if (cVar4 == '$') {
        bVar1 = format[(long)iVar12 + 1];
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar11 = bVar1 - 0x30;
          if (9 < uVar11) {
            __assert_fail("index < 10",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                          ,0x75,
                          "void google::protobuf::strings::SubstituteAndAppend(string *, const char *, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &, const SubstituteArg &)"
                         );
          }
          pSVar8 = local_88[uVar11];
          memcpy(__dest,pSVar8->text_,(long)pSVar8->size_);
          __dest = __dest + pSVar8->size_;
          iVar12 = iVar12 + 1;
        }
        else if (bVar1 == 0x24) {
          *__dest = '$';
          __dest = __dest + 1;
          iVar12 = iVar12 + 1;
        }
      }
      else {
        if (cVar4 == '\0') {
          if ((long)__dest - (long)(psVar3->_M_dataplus)._M_p == psVar3->_M_string_length) {
            return;
          }
          internal::LogMessage::LogMessage
                    (&local_c0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/substitute.cc"
                     ,0x83);
          pLVar6 = internal::LogMessage::operator<<
                             (&local_c0,
                              "CHECK failed: (target - output->data()) == (output->size()): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_120,pLVar6);
          internal::LogMessage::~LogMessage(&local_c0);
          return;
        }
        *__dest = cVar4;
        __dest = __dest + 1;
      }
      iVar12 = iVar12 + 1;
    } while( true );
  }
  return;
}

Assistant:

void SubstituteAndAppend(
    string* output, const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  const SubstituteArg* const args_array[] = {
    &arg0, &arg1, &arg2, &arg3, &arg4, &arg5, &arg6, &arg7, &arg8, &arg9, NULL
  };

  // Determine total size needed.
  int size = 0;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        int index = format[i+1] - '0';
        if (args_array[index]->size() == -1) {
          GOOGLE_LOG(DFATAL)
            << "strings::Substitute format string invalid: asked for \"$"
            << index << "\", but only " << CountSubstituteArgs(args_array)
            << " args were given.  Full format string was: \""
            << CEscape(format) << "\".";
          return;
        }
        size += args_array[index]->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        ++size;
        ++i;  // Skip next char.
      } else {
        GOOGLE_LOG(DFATAL)
          << "Invalid strings::Substitute() format string: \""
          << CEscape(format) << "\".";
        return;
      }
    } else {
      ++size;
    }
  }

  if (size == 0) return;

  // Build the string.
  int original_size = output->size();
  STLStringResizeUninitialized(output, original_size + size);
  char* target = string_as_array(output) + original_size;
  for (int i = 0; format[i] != '\0'; i++) {
    if (format[i] == '$') {
      if (ascii_isdigit(format[i+1])) {
        unsigned int index = format[i+1] - '0';
        assert(index < 10);
        const SubstituteArg* src = args_array[index];
        memcpy(target, src->data(), src->size());
        target += src->size();
        ++i;  // Skip next char.
      } else if (format[i+1] == '$') {
        *target++ = '$';
        ++i;  // Skip next char.
      }
    } else {
      *target++ = format[i];
    }
  }

  GOOGLE_DCHECK_EQ(target - output->data(), output->size());
}